

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# torrent_info.cpp
# Opt level: O0

void __thiscall libtorrent::torrent_info::copy_on_write(torrent_info *this)

{
  bool bVar1;
  file_storage *this_00;
  torrent_info *this_local;
  
  bVar1 = libtorrent::aux::copy_ptr::operator_cast_to_bool((copy_ptr *)&this->m_orig_files);
  if (!bVar1) {
    this_00 = (file_storage *)operator_new(0xb8);
    file_storage::file_storage(this_00,&this->m_files);
    libtorrent::aux::copy_ptr<const_libtorrent::file_storage>::reset(&this->m_orig_files,this_00);
  }
  return;
}

Assistant:

void torrent_info::copy_on_write()
	{
		TORRENT_ASSERT(is_loaded());
		INVARIANT_CHECK;

		if (m_orig_files) return;
		m_orig_files.reset(new file_storage(m_files));
	}